

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O2

void __thiscall
Debug::PosixCrashHandler::setup(PosixCrashHandler *this,string *appName,string *crashDirPath)

{
  ostream *poVar1;
  string path;
  tm local_278;
  sigaction sa;
  stringstream s;
  ostream local_198 [376];
  
  sa.__sigaction_handler.sa_handler = posixSignalHandler;
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.sa_flags = 0x8000004;
  sigaction(6,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(7,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(4,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(8,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&sa,(sigaction *)0x0);
  if (crashDirPath->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&path,(string *)crashDirPath);
    while ((1 < path._M_string_length && (path._M_dataplus._M_p[path._M_string_length - 1] == '/')))
    {
      std::__cxx11::string::erase((ulong)&path,path._M_string_length - 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&s);
    poVar1 = std::operator<<(local_198,(string *)&path);
    poVar1 = std::operator<<(poVar1,"/");
    poVar1 = std::operator<<(poVar1,(string *)appName);
    std::operator<<(poVar1,"_");
    now();
    formatDateTime(local_198,&local_278,"%Y%m%d_%H%M%S");
    std::operator<<(local_198,".bktr");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->m_backtraceFilePath,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::stringstream::~stringstream((stringstream *)&s);
    std::__cxx11::string::~string((string *)&path);
  }
  return;
}

Assistant:

void PosixCrashHandler::setup(const std::string &appName, const std::string &crashDirPath) {
        struct sigaction sa;
        sa.sa_sigaction = posixSignalHandler;
        sigemptyset( &sa.sa_mask );

#ifdef __APPLE__
        /* for some reason we backtrace() doesn't work on osx
       when we use an alternate stack */
        sa.sa_flags = SA_SIGINFO;
#else
        sa.sa_flags = SA_SIGINFO | SA_ONSTACK;
#endif

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );

        if (!crashDirPath.empty()) {
            std::string path = crashDirPath;
            while ((path.size() > 1) &&
                   (path[path.size() - 1] == '/')) {
                path.erase(path.size() - 1);
            }

            std::stringstream s;
            s << path << "/" << appName << "_";
            formatDateTime(s, now(), CHILLOUT_DATETIME);
            s << ".bktr";
            m_backtraceFilePath = s.str();
        }
    }